

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O3

R2Rect * __thiscall R2Rect::Union(R2Rect *__return_storage_ptr__,R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2LogMessage SStack_18;
  
  dVar1 = this->bounds_[0].bounds_.c_[0];
  dVar2 = this->bounds_[0].bounds_.c_[1];
  dVar5 = other->bounds_[0].bounds_.c_[0];
  dVar3 = other->bounds_[0].bounds_.c_[1];
  dVar4 = dVar3;
  dVar6 = dVar5;
  if ((dVar1 <= dVar2) && (dVar4 = dVar2, dVar6 = dVar1, dVar5 <= dVar3)) {
    if (dVar1 <= dVar5) {
      dVar5 = dVar1;
    }
    dVar4 = dVar3;
    dVar6 = dVar5;
    if (dVar3 <= dVar2) {
      dVar4 = dVar2;
    }
  }
  dVar1 = this->bounds_[1].bounds_.c_[0];
  dVar2 = this->bounds_[1].bounds_.c_[1];
  dVar5 = other->bounds_[1].bounds_.c_[0];
  dVar3 = other->bounds_[1].bounds_.c_[1];
  dVar7 = dVar3;
  dVar8 = dVar5;
  if ((dVar1 <= dVar2) && (dVar7 = dVar2, dVar8 = dVar1, dVar5 <= dVar3)) {
    if (dVar1 <= dVar5) {
      dVar5 = dVar1;
    }
    dVar7 = dVar3;
    dVar8 = dVar5;
    if (dVar3 <= dVar2) {
      dVar7 = dVar2;
    }
  }
  __return_storage_ptr__->bounds_[0].bounds_.c_[0] = dVar6;
  __return_storage_ptr__->bounds_[0].bounds_.c_[1] = dVar4;
  __return_storage_ptr__->bounds_[1].bounds_.c_[0] = dVar8;
  __return_storage_ptr__->bounds_[1].bounds_.c_[1] = dVar7;
  if (dVar4 < dVar6 == dVar8 <= dVar7) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
               ,0xac,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_valid() ",0x19);
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const R2Rect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}